

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audioio.cpp
# Opt level: O2

void wavread(char *filename,int *fs,int *nbit,double *x)

{
  byte bVar1;
  int i_1;
  int iVar2;
  uint uVar3;
  FILE *__stream;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  byte local_58 [4];
  undefined4 local_54;
  undefined1 local_50;
  byte bStack_4d;
  uchar for_int_number [4];
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    puts("File not found.");
    return;
  }
  iVar2 = anon_unknown.dwarf_a5b1::CheckHeader((FILE *)__stream);
  if (iVar2 != 0) {
    local_50 = 0;
    local_54 = 0;
    fread(local_58,1,4,__stream);
    uVar3 = 0;
    for (uVar6 = 3; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
      uVar3 = uVar3 << 8 | (uint)local_58[uVar6];
    }
    *fs = uVar3;
    fseek(__stream,6,1);
    fread(local_58,1,2,__stream);
    *nbit = (uint)local_58[0];
    while( true ) {
      sVar4 = fread(&local_54,1,1,__stream);
      if (sVar4 == 0) break;
      if ((char)local_54 == 'd') {
        fread((void *)((long)&local_54 + 1),1,3,__stream);
        iVar2 = bcmp(&local_54,"data",5);
        if (iVar2 == 0) break;
        fseek(__stream,-3,1);
      }
    }
    iVar2 = bcmp(&local_54,"data",5);
    if (iVar2 == 0) {
      fread(local_58,1,4,__stream);
      uVar3 = 0;
      for (uVar6 = 3; -1 < (int)uVar6; uVar6 = uVar6 - 1) {
        uVar3 = uVar3 << 8 | (uint)local_58[uVar6];
      }
      iVar2 = *nbit / 8;
      uVar5 = (long)(int)uVar3 / (long)iVar2;
      dVar9 = ldexp(1.0,*nbit + -1);
      sVar4 = (size_t)iVar2;
      uVar7 = 0;
      uVar8 = uVar5 & 0xffffffff;
      if ((int)uVar5 < 1) {
        uVar8 = uVar7;
      }
      for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
        fread(for_int_number,1,sVar4,__stream);
        bVar1 = for_int_number[sVar4 - 1];
        dVar10 = 0.0;
        if ((char)bVar1 < '\0') {
          dVar10 = ldexp(1.0,*nbit + -1);
          for_int_number[sVar4 - 1] = bVar1 & 0x7f;
        }
        dVar11 = 0.0;
        for (uVar5 = sVar4 - 1 & 0xffffffff; -1 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
          dVar11 = dVar11 * 256.0 + (double)for_int_number[uVar5];
        }
        x[uVar7] = (dVar11 - dVar10) / dVar9;
      }
    }
    else {
      puts("data error.");
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void wavread(const char* filename, int *fs, int *nbit, double *x) {
  FILE *fp = fopen(filename, "rb");
  if (NULL == fp) {
    printf("File not found.\n");
    return;
  }

  if (0 == CheckHeader(fp)) {
    fclose(fp);
    return;
  }

  int x_length;
  if (0 == GetParameters(fp, fs, nbit, &x_length)) {
    fclose(fp);
    return;
  }

  int quantization_byte = *nbit / 8;
  double zero_line = pow(2.0, *nbit - 1);
  double tmp, sign_bias;
  unsigned char for_int_number[4];
  for (int i = 0; i < x_length; ++i) {
    sign_bias = tmp = 0.0;
    fread(for_int_number, 1, quantization_byte, fp);  // "data"
    if (for_int_number[quantization_byte-1] >= 128) {
      sign_bias = pow(2.0, *nbit - 1);
      for_int_number[quantization_byte - 1] =
        for_int_number[quantization_byte - 1] & 0x7F;
    }
    for (int j = quantization_byte - 1; j >= 0; --j)
      tmp = tmp * 256.0 + for_int_number[j];
    x[i] = (tmp - sign_bias) / zero_line;
  }
  fclose(fp);
}